

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  FieldGenerator *pFVar2;
  int i_1;
  long lVar3;
  int i;
  ulong uVar4;
  long lVar5;
  
  io::Printer::Print(printer,"void $classname$::SharedDtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) == '\x01') {
    io::Printer::Print(printer,
                       "::google::protobuf::Arena* arena = GetArenaNoVirtual();\nif (arena != NULL) {\n  return;\n}\n\n"
                      );
  }
  for (uVar4 = 0;
      ppFVar1 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->optimized_order_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar4 = uVar4 + 1) {
    pFVar2 = FieldGeneratorMap::get(&this->field_generators_,ppFVar1[uVar4]);
    (*pFVar2->_vptr_FieldGenerator[0xf])(pFVar2,printer);
  }
  lVar5 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(this->descriptor_ + 0x38); lVar3 = lVar3 + 1) {
    io::Printer::Print(printer,"if (has_$oneof_name$()) {\n  clear_$oneof_name$();\n}\n",
                       "oneof_name",*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar5));
    lVar5 = lVar5 + 0x30;
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.ClearAll();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedDestructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedDtor() {\n",
    "classname", classname_);
  printer->Indent();
  if (SupportsArenas(descriptor_)) {
    // Do nothing when the message is allocated in an arena.
    printer->Print(
      "::google::protobuf::Arena* arena = GetArenaNoVirtual();\n"
      "if (arena != NULL) {\n"
      "  return;\n"
      "}\n"
      "\n");
  }

  // Write the destructors for each field except oneof members.
  // optimized_order_ does not contain oneof fields.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    field_generators_.get(field).GenerateDestructorCode(printer);
  }

  // Generate code to destruct oneofs. Clearing should do the work.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "if (has_$oneof_name$()) {\n"
        "  clear_$oneof_name$();\n"
        "}\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}